

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_fast_str_kv.cc
# Opt level: O3

void btree_fast_str_kv_get_key(void *key,void *strbuf,size_t *len)

{
  ushort uVar1;
  ushort *puVar2;
  ushort uVar3;
  size_t __n;
  
  puVar2 = *key;
  if (puVar2 == (ushort *)0x0) {
    __n = 0;
  }
  else {
    uVar1 = *puVar2;
    uVar3 = uVar1 << 8 | uVar1 >> 8;
    if (uVar1 == 0xffff) {
      __n = (size_t)uVar3;
    }
    else {
      __n = (size_t)uVar3;
      memcpy(strbuf,puVar2 + 1,__n);
    }
  }
  *len = __n;
  return;
}

Assistant:

void btree_fast_str_kv_get_key(void *key, void *strbuf, size_t *len)
{
    void *key_ptr;
    key_len_t keylen, inflen;
    key_len_t _keylen;

    memset(&inflen, 0xff, sizeof(key_len_t));

    memcpy(&key_ptr, key, sizeof(void *));
    if (key_ptr) {
        memcpy(&_keylen, key_ptr, sizeof(key_len_t));
        keylen = _endian_decode(_keylen);
        if (keylen != inflen) {
            memcpy(strbuf, (uint8_t*)key_ptr + sizeof(key_len_t), keylen);
        }
        *len = keylen;
    } else {
        *len = 0;
    }
}